

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# file.h
# Opt level: O0

ostream * __thiscall wasm::Output::operator<<(Output *this,char **v)

{
  ostream *poVar1;
  char **v_local;
  Output *this_local;
  
  poVar1 = std::operator<<((ostream *)(this + 0x200),*v);
  return poVar1;
}

Assistant:

~Output() = default;